

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O3

void apply_saturation(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float saturation_val)

{
  pointer pMVar1;
  ostream *poVar2;
  pointer pMVar3;
  int in_R8D;
  Mat hsv;
  _InputArray local_208;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  pointer local_1e8;
  undefined8 local_1e0 [12];
  Mat local_180 [96];
  Mat local_120 [144];
  Mat local_90 [96];
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::blue_abi_cxx11_,DAT_00158610);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Changing Saturation : ",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,color::reset_abi_cxx11_,DAT_00158670);
  pMVar3 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar3 != pMVar1) {
    do {
      cv::Mat::Mat(local_90);
      local_1e0[0] = 0;
      local_1f0 = 0x1010000;
      local_208.sz.width = 0;
      local_208.sz.height = 0;
      local_208.flags = 0x2010000;
      local_208.obj = local_90;
      local_1e8 = pMVar3;
      cv::cvtColor((cv *)&local_1f0,&local_208,(_OutputArray *)0x28,0,in_R8D);
      cv::operator*((Mat *)&local_1f0,(double)saturation_val);
      (**(code **)(*(long *)CONCAT44(uStack_1ec,local_1f0) + 0x18))
                ((long *)CONCAT44(uStack_1ec,local_1f0),(cv *)&local_1f0,local_90);
      cv::Mat::~Mat(local_120);
      cv::Mat::~Mat(local_180);
      cv::Mat::~Mat((Mat *)local_1e0);
      local_1e0[0] = 0;
      local_1f0 = 0x1010000;
      local_208.sz.width = 0;
      local_208.sz.height = 0;
      local_208.flags = 0x2010000;
      local_208.obj = pMVar3;
      local_1e8 = local_90;
      cv::cvtColor((cv *)&local_1f0,&local_208,(_OutputArray *)0x36,0,in_R8D);
      cv::Mat::~Mat(local_90);
      pMVar3 = pMVar3 + 0x60;
    } while (pMVar3 != pMVar1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::green_abi_cxx11_,DAT_001585f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Done",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,color::reset_abi_cxx11_,DAT_00158670);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void apply_saturation(std::vector<cv::Mat> &image_list, float saturation_val) {
   std::cout << color::blue << "Changing Saturation : " << color::reset;
   for(auto &img : image_list) {
      Mat hsv;
      cvtColor(img, hsv, COLOR_BGR2HSV);
      float factor = saturation_val;
      hsv = hsv * factor;
      cvtColor(hsv, img, COLOR_HSV2BGR);
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}